

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_duplex.cpp
# Opt level: O3

void state_cb_duplex(cubeb_stream *stream,void *param_2,cubeb_state state)

{
  undefined8 in_RAX;
  
  if (stream != (cubeb_stream *)0x0) {
    if (state == CUBEB_STATE_DRAINED) {
      state_cb_duplex();
    }
    else if (state == CUBEB_STATE_STOPPED) {
      state_cb_duplex();
    }
    else {
      if (state != CUBEB_STATE_STARTED) {
        fprintf(_stderr,"unknown stream state %d\n",state,in_RAX);
        return;
      }
      state_cb_duplex();
    }
  }
  return;
}

Assistant:

void state_cb_duplex(cubeb_stream * stream, void * /*user*/, cubeb_state state)
{
  if (stream == NULL)
    return;

  switch (state) {
  case CUBEB_STATE_STARTED:
    fprintf(stderr, "stream started\n"); break;
  case CUBEB_STATE_STOPPED:
    fprintf(stderr, "stream stopped\n"); break;
  case CUBEB_STATE_DRAINED:
    fprintf(stderr, "stream drained\n"); break;
  default:
    fprintf(stderr, "unknown stream state %d\n", state);
  }

  return;
}